

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::grow
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this,size_t size)

{
  allocator_type *paVar1;
  size_t sVar2;
  allocator_type *paVar3;
  buffer<wchar_t> *__p;
  pointer __result;
  allocator_type *in_RSI;
  buffer<wchar_t> *in_RDI;
  wchar_t *new_data;
  wchar_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_type in_stack_ffffffffffffffa8;
  allocator_type *in_stack_ffffffffffffffb0;
  buffer<wchar_t> *__n;
  allocator_type *__first;
  
  v10::detail::abort_fuzzing_if(false);
  paVar1 = (allocator_type *)
           std::allocator_traits<std::allocator<wchar_t>_>::max_size((allocator_type *)0x1d7290);
  sVar2 = v10::detail::buffer<wchar_t>::capacity(in_RDI);
  paVar3 = (allocator_type *)(sVar2 + (sVar2 >> 1));
  __first = in_RSI;
  if (((in_RSI <= paVar3) && (__first = paVar3, paVar1 < paVar3)) &&
     (in_stack_ffffffffffffffb0 = paVar1, __first = paVar1, paVar1 < in_RSI)) {
    in_stack_ffffffffffffffb0 = in_RSI;
    __first = in_RSI;
  }
  __p = (buffer<wchar_t> *)v10::detail::buffer<wchar_t>::data(in_RDI);
  __result = std::allocator_traits<std::allocator<wchar_t>_>::allocate
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  v10::detail::buffer<wchar_t>::size(in_RDI);
  __n = __p;
  v10::detail::buffer<wchar_t>::size(in_RDI);
  std::uninitialized_copy_n<wchar_t*,unsigned_long,wchar_t*>
            ((wchar_t *)__first,(unsigned_long)__n,__result);
  v10::detail::buffer<wchar_t>::set(in_RDI,__result,(size_t)__first);
  if (__n != in_RDI + 1) {
    __gnu_cxx::new_allocator<wchar_t>::deallocate
              ((new_allocator<wchar_t> *)in_stack_ffffffffffffffb0,(wchar_t *)__p,0x1d73b3);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t size) override {
    detail::abort_fuzzing_if(size > 5000);
    const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
    size_t old_capacity = this->capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = size > max_size ? size : max_size;
    T* old_data = this->data();
    T* new_data =
        std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(this->size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    std::uninitialized_copy_n(old_data, this->size(), new_data);
    this->set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
  }